

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_create_metadata(lyd_node *leader,lyd_meta **meta_p)

{
  int iVar1;
  lys_module *mod;
  ly_ctx *local_50;
  ly_ctx *local_48;
  LY_ERR ret__;
  lys_module *modyang;
  lyd_meta *meta;
  uint32_t i;
  LY_ERR ret;
  lyd_meta **meta_p_local;
  lyd_node *leader_local;
  
  _i = meta_p;
  meta_p_local = (lyd_meta **)leader;
  if ((leader != (lyd_node *)0x0) &&
     ((leader->prev->next == (lyd_node *)0x0 || (leader->schema != leader->prev->schema)))) {
    lyds_get_rb_tree(leader,(lyd_meta **)&modyang);
    if (modyang == (lys_module *)0x0) {
      meta._0_4_ = 0;
      do {
        if (meta_p_local[1] == (lyd_meta *)0x0) {
          local_48 = (ly_ctx *)meta_p_local[0xf];
        }
        else {
          local_48 = (ly_ctx *)meta_p_local[1]->next->parent;
        }
        mod = ly_ctx_get_module_iter(local_48,(uint32_t *)&meta);
      } while ((mod != (lys_module *)0x0) && (iVar1 = strcmp(mod->name,"yang"), iVar1 != 0));
      if (mod == (lys_module *)0x0) {
        if (meta_p_local[1] == (lyd_meta *)0x0) {
          local_50 = (ly_ctx *)meta_p_local[0xf];
        }
        else {
          local_50 = (ly_ctx *)meta_p_local[1]->next->parent;
        }
        ly_log(local_50,LY_LLERR,LY_EINT,"The yang module is not installed.");
        leader_local._4_4_ = LY_EINT;
      }
      else {
        leader_local._4_4_ =
             lyd_create_meta((lyd_node *)meta_p_local,(lyd_meta **)&modyang,mod,"lyds_tree",9,
                             (char *)0x0,0,'\0','\x01',(ly_bool *)0x0,LY_VALUE_CANON,(void *)0x0,
                             0x3f3,(lysc_node *)0x0,'\0',(ly_bool *)0x0);
        if (leader_local._4_4_ == LY_SUCCESS) {
          if (_i != (lyd_meta **)0x0) {
            *_i = (lyd_meta *)modyang;
          }
          leader_local._4_4_ = LY_SUCCESS;
        }
      }
    }
    else {
      leader_local._4_4_ = LY_SUCCESS;
    }
    return leader_local._4_4_;
  }
  __assert_fail("leader && (!leader->prev->next || (leader->schema != leader->prev->schema))",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0x486,"LY_ERR lyds_create_metadata(struct lyd_node *, struct lyd_meta **)");
}

Assistant:

LY_ERR
lyds_create_metadata(struct lyd_node *leader, struct lyd_meta **meta_p)
{
    LY_ERR ret;
    uint32_t i;
    struct lyd_meta *meta;
    struct lys_module *modyang;

    assert(leader && (!leader->prev->next || (leader->schema != leader->prev->schema)));

    lyds_get_rb_tree(leader, &meta);
    if (meta) {
        /* nothing to do, the metadata is already set */
        return LY_SUCCESS;
    }

    /* Check that the 'yang' module is defined. */
    i = 0;
    while ((modyang = ly_ctx_get_module_iter(LYD_CTX(leader), &i))) {
        if (!strcmp(modyang->name, "yang")) {
            break;
        }
    }
    LY_CHECK_ERR_RET(!modyang, LOGERR(LYD_CTX(leader), LY_EINT, "The yang module is not installed."), LY_EINT);

    /* create new metadata, its rbt is NULL */
    ret = lyd_create_meta(leader, &meta, modyang, "lyds_tree", 9, NULL, 0, 0, 1, NULL,
            LY_VALUE_CANON, NULL, LYD_HINT_DATA, NULL, 0, NULL);
    LY_CHECK_RET(ret);

    if (meta_p) {
        *meta_p = meta;
    }

    return LY_SUCCESS;
}